

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O0

int __thiscall pg::SSISolver::mark_solved(SSISolver *this,int side)

{
  unsigned_long *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  char *pcVar8;
  _label_vertex _Var9;
  byte local_269;
  byte local_22a;
  byte local_229;
  int **local_228;
  bitset *local_220;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [28];
  int u;
  int *curedge_2;
  undefined1 local_1a8 [4];
  int to_1;
  size_t local_188;
  size_t v_3;
  int local_178;
  _label_vertex local_170;
  Game *local_160;
  int local_158;
  _label_vertex local_150;
  Game *local_140;
  int local_138;
  _label_vertex local_130;
  size_t local_120;
  size_t v_2;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [28];
  int to;
  int *curedge_1;
  undefined1 local_c0 [7];
  bool escapes;
  undefined1 local_b0 [28];
  int from;
  int *curedge;
  size_t sStack_88;
  uint v_1;
  size_t v;
  int **ppiStack_78;
  int count;
  int **S;
  bitset *W;
  SSISolver *pSStack_60;
  int side_local;
  SSISolver *this_local;
  uintqueue *local_50;
  uint local_44;
  uintqueue *local_40;
  uintqueue *local_38;
  uintqueue *local_30;
  char local_21;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  W._4_4_ = side;
  pSStack_60 = this;
  bVar3 = bitset::none(&this->C);
  if (bVar3) {
    this_local._0_4_ = 0;
  }
  else {
    if (W._4_4_ == 0) {
      local_220 = &this->W0;
    }
    else {
      local_220 = &this->W1;
    }
    S = (int **)local_220;
    if (W._4_4_ == 0) {
      local_228 = &this->str0;
    }
    else {
      local_228 = &this->str1;
    }
    ppiStack_78 = local_228;
    bitset::operator|=(local_220,&this->C);
    v._4_4_ = 0;
    for (sStack_88 = bitset::find_first(&this->C); sStack_88 != 0xffffffffffffffff;
        sStack_88 = bitset::find_next(&this->C,sStack_88)) {
      local_40 = &this->Q;
      local_44 = (uint)sStack_88;
      iVar7 = (this->Q).pointer;
      (this->Q).pointer = iVar7 + 1;
      local_40->queue[iVar7] = local_44;
    }
    while (local_38 = &this->Q, (this->Q).pointer != 0) {
      local_30 = &this->Q;
      iVar7 = (this->Q).pointer + -1;
      (this->Q).pointer = iVar7;
      curedge._4_4_ = local_30->queue[iVar7];
      v._4_4_ = v._4_4_ + 1;
      for (register0x00000000 = (uint *)Solver::ins(&this->super_Solver,curedge._4_4_);
          *stack0xffffffffffffff68 != 0xffffffff; register0x00000000 = stack0xffffffffffffff68 + 1)
      {
        local_b0._20_4_ = *stack0xffffffffffffff68;
        bitset::operator[]((bitset *)local_b0,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_b0);
        local_229 = 0;
        if (bVar3) {
          bitset::operator[]((bitset *)local_c0,(size_t)S);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_c0);
          local_229 = bVar3 ^ 0xff;
        }
        if ((local_229 & 1) != 0) {
          iVar7 = Solver::owner(&this->super_Solver,local_b0._20_4_);
          if (iVar7 == W._4_4_) {
            (*ppiStack_78)[(int)local_b0._20_4_] = curedge._4_4_;
          }
          else {
            curedge_1._7_1_ = 0;
            for (register0x00000000 = Solver::outs(&this->super_Solver,local_b0._20_4_);
                *stack0xffffffffffffff30 != -1; register0x00000000 = stack0xffffffffffffff30 + 1) {
              local_e8._20_4_ = *stack0xffffffffffffff30;
              bitset::operator[]((bitset *)local_e8,(size_t)&this->G);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_e8);
              local_22a = 0;
              if (bVar3) {
                bitset::operator[]((bitset *)local_f8,(size_t)S);
                bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_f8);
                local_22a = bVar3 ^ 0xff;
              }
              if ((local_22a & 1) != 0) {
                curedge_1._7_1_ = 1;
                break;
              }
            }
            if ((curedge_1._7_1_ & 1) != 0) goto LAB_001efc2c;
          }
          bitset::operator[]((bitset *)local_108,(size_t)&this->C);
          bitset::reference::operator=((reference *)local_108,true);
          bitset::operator[]((bitset *)&v_2,(size_t)S);
          bitset::reference::operator=((reference *)&v_2,true);
          local_50 = &this->Q;
          this_local._4_4_ = local_b0._20_4_;
          iVar7 = (this->Q).pointer;
          (this->Q).pointer = iVar7 + 1;
          local_50->queue[iVar7] = local_b0._20_4_;
        }
LAB_001efc2c:
      }
    }
    if (1 < (this->super_Solver).trace) {
      for (local_120 = bitset::find_first(&this->C); local_120 != 0xffffffffffffffff;
          local_120 = bitset::find_next(&this->C,local_120)) {
        iVar7 = Solver::owner(&this->super_Solver,(int)local_120);
        if (iVar7 == W._4_4_) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mvertex ");
          _Var9 = Solver::label_vertex(&this->super_Solver,(int)local_120);
          local_140 = _Var9.g;
          local_138 = _Var9.v;
          local_130.g = local_140;
          local_130.v = local_138;
          poVar5 = operator<<(poVar5,&local_130);
          poVar5 = std::operator<<(poVar5," is now won by ");
          pcVar8 = "Odd";
          if (W._4_4_ == 0) {
            pcVar8 = "Even";
          }
          poVar5 = std::operator<<(poVar5,pcVar8);
          poVar5 = std::operator<<(poVar5," with strategy ");
          _Var9 = Solver::label_vertex(&this->super_Solver,(*ppiStack_78)[local_120]);
          local_160 = _Var9.g;
          local_158 = _Var9.v;
          local_150.g = local_160;
          local_150.v = local_158;
          poVar5 = operator<<(poVar5,&local_150);
          poVar5 = std::operator<<(poVar5,"!\x1b[m");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mvertex ");
          _Var9 = Solver::label_vertex(&this->super_Solver,(int)local_120);
          v_3 = (size_t)_Var9.g;
          local_178 = _Var9.v;
          local_170.g = (Game *)v_3;
          local_170.v = local_178;
          poVar5 = operator<<(poVar5,&local_170);
          poVar5 = std::operator<<(poVar5," is now won by ");
          pcVar8 = "Odd";
          if (W._4_4_ == 0) {
            pcVar8 = "Even";
          }
          poVar5 = std::operator<<(poVar5,pcVar8);
          poVar5 = std::operator<<(poVar5,"!\x1b[m");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    bitset::operator-=(&this->G,(bitset *)S);
    bitset::operator&=(&this->V0,&this->G);
    bitset::operator&=(&this->V1,&this->G);
    local_10 = &this->halt0;
    puVar1 = local_10->_bits;
    puVar2 = local_10->_bits;
    sVar6 = bitset::num_blocks(local_10);
    local_11 = '\0';
    std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar6,&local_11);
    local_20 = &this->halt1;
    puVar1 = local_20->_bits;
    puVar2 = local_20->_bits;
    sVar6 = bitset::num_blocks(local_20);
    local_21 = '\0';
    std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar6,&local_21);
    for (local_188 = bitset::find_first(&this->G); local_188 != 0xffffffffffffffff;
        local_188 = bitset::find_next(&this->G,local_188)) {
      bitset::operator[]((bitset *)&stack0xfffffffffffffe68,(size_t)&this->G);
      bVar3 = bitset::reference::operator_cast_to_bool((reference *)&stack0xfffffffffffffe68);
      local_269 = 1;
      if (bVar3) {
        bitset::operator[]((bitset *)local_1a8,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1a8);
        local_269 = bVar3 ^ 0xff;
      }
      if ((local_269 & 1) != 0) {
        curedge_2._4_4_ = -1;
        for (register0x00000000 = Solver::outs(&this->super_Solver,(int)local_188);
            *stack0xfffffffffffffe48 != -1; register0x00000000 = stack0xfffffffffffffe48 + 1) {
          local_1d0._20_4_ = *stack0xfffffffffffffe48;
          bitset::operator[]((bitset *)local_1d0,(size_t)&this->G);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1d0);
          if (bVar3) {
            curedge_2._4_4_ = local_1d0._20_4_;
            break;
          }
        }
        bitset::operator[]((bitset *)local_1e0,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1e0);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          this->str0[local_188] = curedge_2._4_4_;
        }
        bitset::operator[]((bitset *)local_1f0,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1f0);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          this->str1[local_188] = curedge_2._4_4_;
        }
      }
      uVar4 = Solver::priority(&this->super_Solver,(int)local_188);
      if ((uVar4 & 1) == 0) {
        bitset::operator[]((bitset *)local_210,(size_t)&this->halt1);
        bitset::reference::operator=((reference *)local_210,true);
      }
      else {
        bitset::operator[]((bitset *)local_200,(size_t)&this->halt0);
        bitset::reference::operator=((reference *)local_200,true);
      }
    }
    this_local._0_4_ = v._4_4_;
  }
  return (int)this_local;
}

Assistant:

int
SSISolver::mark_solved(int side)
{
    if (C.none()) return 0;

    auto & W = side == 0 ? W0 : W1;
    auto & S = side == 0 ? str0 : str1;

    // the vertices in C are the new winning region (dominion)
    W |= C;

    // attract to the winning region
    int count = 0;
    for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
        Q.push(v);
    }
    while (Q.nonempty()) {
        auto v = Q.pop();
        count++;
        for (auto curedge = ins(v); *curedge != -1; curedge++) {
            auto from = *curedge;
            if (G[from] and !W[from]) {
                if (owner(from) != side) {
                    // check if escapes
                    bool escapes = false;
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        auto to = *curedge;
                        if (G[to] && !W[to]) {
                            escapes = true;
                            break;
                        }
                    }
                    if (escapes) continue;
                } else {
                    S[from] = v;
                }
                C[from] = true;
                W[from] = true;
                Q.push(from);
            }
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
            if (owner(v) == side) {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << " with strategy " << label_vertex(S[v]) << "!\033[m" << std::endl;
            } else {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << "!\033[m" << std::endl;
            }
        }
    }
#endif

    // remove maximized winning region from remaining game
    G -= W;
    V0 &= G;
    V1 &= G;

    // partially reset the strategies and reset halting
    halt0.reset();
    halt1.reset();
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        if (!G[str0[v]] || !G[str1[v]]) {
            // select first available edge
            int to = -1;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                int u = *curedge;
                if (G[u]) {
                    to = u;
                    break;
                }
            }
            if (!G[str0[v]]) str0[v] = to;
            if (!G[str1[v]]) str1[v] = to;
        }

        if (priority(v)&1) {
            halt0[v] = true;
        } else {
            halt1[v] = true;
        }
    }

    return count;
}